

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_info.cpp
# Opt level: O1

XrSdkSessionLabelPtr __thiscall
XrSdkSessionLabel::make(XrSdkSessionLabel *this,XrDebugUtilsLabelEXT *label_info,bool individual)

{
  void *pvVar1;
  string *this_00;
  allocator local_21;
  
  this_00 = (string *)operator_new(0x40);
  std::__cxx11::string::string(this_00,label_info->labelName,&local_21);
  *(char **)(this_00 + 0x30) = label_info->labelName;
  pvVar1 = label_info->next;
  *(undefined8 *)(this_00 + 0x20) = *(undefined8 *)label_info;
  *(void **)(this_00 + 0x28) = pvVar1;
  this_00[0x38] = (string)individual;
  *(undefined8 *)(this_00 + 0x30) = *(undefined8 *)this_00;
  *(undefined8 *)(this_00 + 0x28) = 0;
  (this->label_name)._M_dataplus._M_p = (pointer)this_00;
  return (__uniq_ptr_data<XrSdkSessionLabel,_std::default_delete<XrSdkSessionLabel>,_true,_true>)
         (__uniq_ptr_data<XrSdkSessionLabel,_std::default_delete<XrSdkSessionLabel>,_true,_true>)
         this;
}

Assistant:

XrSdkSessionLabelPtr XrSdkSessionLabel::make(const XrDebugUtilsLabelEXT& label_info, bool individual) {
    XrSdkSessionLabelPtr ret(new XrSdkSessionLabel(label_info, individual));
    return ret;
}